

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int luaopen_string(lua_State *L)

{
  lua_State *L_local;
  
  luaL_checkversion_(L,503.0,0x88);
  lua_createtable(L,0,0x11);
  luaL_setfuncs(L,strlib,0);
  createmetatable(L);
  return 1;
}

Assistant:

LUAMOD_API int luaopen_string (lua_State *L) {
  luaL_newlib(L, strlib);
  createmetatable(L);
  return 1;
}